

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O0

void Psr_ManCleanMap(Psr_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  int Sig;
  int NameId;
  int k;
  int i;
  Vec_Int_t *vSigs;
  Vec_Int_t *vMap_local;
  Psr_Ntk_t *pNtk_local;
  
  NameId = 0;
  while( true ) {
    iVar1 = Psr_NtkPiNum(pNtk);
    bVar2 = false;
    if (NameId < iVar1) {
      local_2c = Vec_IntEntry(&pNtk->vInputs,NameId);
      bVar2 = local_2c != 0;
    }
    if (!bVar2) break;
    Vec_IntWriteEntry(vMap,local_2c,-1);
    NameId = NameId + 1;
  }
  NameId = 0;
  while( true ) {
    iVar1 = Psr_NtkBoxNum(pNtk);
    bVar2 = false;
    if (NameId < iVar1) {
      _k = Psr_BoxSignals(pNtk,NameId);
      bVar2 = _k != (Vec_Int_t *)0x0;
    }
    if (!bVar2) break;
    for (Sig = 0; iVar1 = Vec_IntSize(_k), Sig + 1 < iVar1; Sig = Sig + 2) {
      local_2c = Vec_IntEntry(_k,Sig);
      iVar1 = Vec_IntEntry(_k,Sig + 1);
      iVar1 = Psr_NtkSigName(pNtk,iVar1);
      Vec_IntWriteEntry(vMap,iVar1,-1);
    }
    NameId = NameId + 1;
  }
  NameId = 0;
  while( true ) {
    iVar1 = Psr_NtkPoNum(pNtk);
    bVar2 = false;
    if (NameId < iVar1) {
      local_2c = Vec_IntEntry(&pNtk->vOutputs,NameId);
      bVar2 = local_2c != 0;
    }
    if (!bVar2) break;
    Vec_IntWriteEntry(vMap,local_2c,-1);
    NameId = NameId + 1;
  }
  return;
}

Assistant:

void Psr_ManCleanMap( Psr_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Vec_Int_t * vSigs; 
    int i, k, NameId, Sig;
    Psr_NtkForEachPi( pNtk, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
    Psr_NtkForEachBox( pNtk, vSigs, i )
        Vec_IntForEachEntryDouble( vSigs, NameId, Sig, k )
            Vec_IntWriteEntry( vMap, Psr_NtkSigName(pNtk, Sig), -1 );
    Psr_NtkForEachPo( pNtk, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
}